

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O3

int yy_scalar(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  char *cclass;
  code *action;
  char *name;
  
  iVar7 = G->pos;
  iVar6 = G->thunkpos;
  yyDo(G,yyPush,1,0,"yyPush");
  iVar5 = G->pos;
  iVar1 = G->thunkpos;
  iVar3 = yymatchChar(G,0x24);
  if ((iVar3 == 0) || (iVar3 = yy_scalar(G), iVar3 == 0)) {
    G->pos = iVar5;
    G->thunkpos = iVar1;
    yyText(G,G->begin,G->end);
    G->begin = G->pos;
    iVar3 = yymatchChar(G,0x24);
    if ((iVar3 == 0) || (iVar3 = yy_varname(G), iVar3 == 0)) {
      G->pos = iVar5;
      G->thunkpos = iVar1;
      iVar3 = yymatchString(G,"$!");
      if (iVar3 != 0) {
        iVar3 = G->pos;
        iVar2 = G->thunkpos;
        iVar4 = yymatchClass(G,(uchar *)"",cclass);
        if (iVar4 == 0) {
          G->pos = iVar3;
          G->thunkpos = iVar2;
          iVar7 = G->begin;
          iVar6 = G->end;
          action = yy_3_scalar;
          name = "yy_3_scalar";
          goto LAB_00109c14;
        }
      }
      G->pos = iVar5;
      G->thunkpos = iVar1;
      iVar5 = yymatchString(G,"$/");
      if (iVar5 == 0) {
        G->pos = iVar7;
        G->thunkpos = iVar6;
        return 0;
      }
      iVar7 = G->begin;
      iVar6 = G->end;
      action = yy_4_scalar;
      name = "yy_4_scalar";
    }
    else {
      yyText(G,G->begin,G->end);
      iVar6 = G->pos;
      iVar7 = G->begin;
      G->end = iVar6;
      action = yy_2_scalar;
      name = "yy_2_scalar";
    }
  }
  else {
    yyDo(G,yySet,-1,0,"yySet");
    iVar7 = G->begin;
    iVar6 = G->end;
    action = yy_1_scalar;
    name = "yy_1_scalar";
  }
LAB_00109c14:
  yyDo(G,action,iVar7,iVar6,name);
  yyDo(G,yyPop,1,0,"yyPop");
  return 1;
}

Assistant:

YY_RULE(int) yy_scalar(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyDo(G, yyPush, 1, 0, "yyPush");
  yyprintfv((stderr, "%s\n", "scalar"));

  {  int yypos823= G->pos, yythunkpos823= G->thunkpos;  if (!yymatchChar(G, '$')) goto l824;
  if (!yy_scalar(G))  goto l824;
  yyDo(G, yySet, -1, 0, "yySet");
  yyDo(G, yy_1_scalar, G->begin, G->end, "yy_1_scalar");
  goto l823;
  l824:;	  G->pos= yypos823; G->thunkpos= yythunkpos823;  yyText(G, G->begin, G->end);  if (!(YY_BEGIN)) goto l825;  if (!yymatchChar(G, '$')) goto l825;
  if (!yy_varname(G))  goto l825;
  yyText(G, G->begin, G->end);  if (!(YY_END)) goto l825;  yyDo(G, yy_2_scalar, G->begin, G->end, "yy_2_scalar");
  goto l823;
  l825:;	  G->pos= yypos823; G->thunkpos= yythunkpos823;  if (!yymatchString(G, "$!")) goto l826;

  {  int yypos827= G->pos, yythunkpos827= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\000\377\003\376\377\377\207\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "a-zA-Z0-9_")) goto l827;
  goto l826;
  l827:;	  G->pos= yypos827; G->thunkpos= yythunkpos827;
  }  yyDo(G, yy_3_scalar, G->begin, G->end, "yy_3_scalar");
  goto l823;
  l826:;	  G->pos= yypos823; G->thunkpos= yythunkpos823;  if (!yymatchString(G, "$/")) goto l822;
  yyDo(G, yy_4_scalar, G->begin, G->end, "yy_4_scalar");

  }
  l823:;	  yyprintf((stderr, "  ok   scalar"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));
  yyDo(G, yyPop, 1, 0, "yyPop");
  return 1;
  l822:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "scalar"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}